

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_shrinkstack(lua_State *L)

{
  CallInfo *pCVar1;
  int iVar2;
  int iVar3;
  CallInfo **ppCVar4;
  int iVar5;
  StkId pTVar6;
  
  pTVar6 = L->top;
  ppCVar4 = &L->ci;
  while (pCVar1 = *ppCVar4, pCVar1 != (CallInfo *)0x0) {
    if (pTVar6 < pCVar1->top) {
      pTVar6 = pCVar1->top;
    }
    ppCVar4 = &pCVar1->previous;
  }
  iVar2 = (int)((ulong)((long)pTVar6 - (long)L->stack) >> 4);
  iVar3 = (iVar2 + 1) / 8 + iVar2 + 1;
  iVar5 = 0xf4236;
  if (iVar3 < 0xf4236) {
    iVar5 = iVar3;
  }
  if (L->stacksize < 0xf4241) {
    luaE_shrinkCI(L);
  }
  else {
    luaE_freeCI(L);
  }
  if ((iVar2 < 0xf423b) && (iVar5 + 10 < L->stacksize)) {
    luaD_reallocstack(L,iVar5 + 10);
    return;
  }
  return;
}

Assistant:

void luaD_shrinkstack(lua_State *L) {
    int inuse = stackinuse(L);
    int goodsize = inuse + (inuse / 8) + 2 * EXTRA_STACK;
    if (goodsize > LUAI_MAXSTACK)
        goodsize = LUAI_MAXSTACK;  /* respect stack limit */
    if (L->stacksize > LUAI_MAXSTACK)  /* had been handling stack overflow? */
        luaE_freeCI(L);  /* free all CIs (list grew because of an error) */
    else
        luaE_shrinkCI(L);  /* shrink list */
    /* if thread is currently not handling a stack overflow and its
       good size is smaller than current size, shrink its stack */
    if (inuse <= (LUAI_MAXSTACK - EXTRA_STACK) &&
        goodsize < L->stacksize)
        luaD_reallocstack(L, goodsize);
    else  /* don't change stack */
        condmovestack(L, {}, {});  /* (change only for debugging) */
}